

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

void __thiscall n_e_s::core::Mos6502::execute(Mos6502 *this)

{
  bool bVar1;
  Pipeline local_c0;
  Pipeline local_68;
  Mos6502 *local_10;
  Mos6502 *this_local;
  
  local_10 = this;
  bVar1 = Pipeline::done(&this->pipeline_);
  if (bVar1) {
    if ((this->nmi_ & 1U) == 0) {
      parse_next_instruction(&local_c0,this);
      Pipeline::operator=(&this->pipeline_,&local_c0);
      Pipeline::~Pipeline(&local_c0);
    }
    else {
      create_nmi(&local_68,this);
      Pipeline::operator=(&this->pipeline_,&local_68);
      Pipeline::~Pipeline(&local_68);
      this->nmi_ = false;
    }
  }
  else {
    Pipeline::execute_step(&this->pipeline_);
  }
  (this->state_).cycle = (this->state_).cycle + 1;
  return;
}

Assistant:

void Mos6502::execute() {
    if (pipeline_.done()) {
        if (nmi_) {
            pipeline_ = create_nmi();
            nmi_ = false;
        } else {
            pipeline_ = parse_next_instruction();
        }
    } else {
        pipeline_.execute_step();
    }
    ++state_.cycle;
}